

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_lshr(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  ulong uVar1;
  Value VVar2;
  Value VVar3;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  uVar1 = VVar3._0_8_;
  if (VVar2.type != INT) {
    __assert_fail("value_2.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x982,"void ExecutionEngine::i_lshr()");
  }
  if ((uVar1 & 0xffffffff00000000) == 0x600000000) {
    VVar2.data.longValue = VVar3.data.longValue >> (VVar2.data._0_1_ & 0x3f);
    VVar2.printType = (int)uVar1;
    VVar2.type = (int)(uVar1 >> 0x20);
    Frame::pushIntoOperandStack(this_01,VVar2);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::LONG",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x983,"void ExecutionEngine::i_lshr()");
}

Assistant:

void ExecutionEngine::i_lshr() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value_2 = topFrame->popTopOfOperandStack();
    Value value_1 = topFrame->popTopOfOperandStack();
    // Sobra um padding na pilha que ficará abaixo do resultado

    assert(value_2.type == ValueType::INT);
    assert(value_1.type == ValueType::LONG);

	// value_2 armazena seus 6 primeiros bits
	value_2.data.longValue = 0x3f & value_2.data.longValue;
	value_1.data.longValue = value_1.data.longValue >> value_2.data.longValue;
    topFrame->pushIntoOperandStack(value_1);

    topFrame->pc += 1;
}